

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

tuple<bool,_bool,_unsigned_int> * __thiscall
spvtools::val::ValidationState_t::EvalInt32IfConst
          (tuple<bool,_bool,_unsigned_int> *__return_storage_ptr__,ValidationState_t *this,
          uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  int32_t iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar5;
  uint32_t local_64;
  bool local_5e;
  bool local_5d;
  int local_5c;
  bool local_56;
  bool local_55;
  tuple<bool,_bool,_int> local_54;
  int local_4c;
  bool local_46;
  bool local_45;
  tuple<bool,_bool,_int> local_44;
  int local_3c;
  bool local_36;
  bool local_35;
  tuple<bool,_bool,_int> local_34;
  uint32_t local_2c;
  Instruction *pIStack_28;
  uint32_t type;
  Instruction *inst;
  ValidationState_t *pVStack_18;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  inst._4_4_ = id;
  pVStack_18 = this;
  this_local = (ValidationState_t *)__return_storage_ptr__;
  pIStack_28 = FindDef(this,id);
  if (pIStack_28 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x591,
                  "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                 );
  }
  local_2c = Instruction::type_id(pIStack_28);
  if (((local_2c == 0) || (bVar1 = IsIntScalarType(this,local_2c), !bVar1)) ||
     (uVar2 = GetBitWidth(this,local_2c), uVar2 != 0x20)) {
    local_35 = false;
    local_36 = false;
    local_3c = 0;
    std::make_tuple<bool,bool,int>(&local_34,&local_35,&local_36,&local_3c);
    std::tuple<bool,_bool,_unsigned_int>::tuple<bool,_bool,_int,_true,_true>
              (__return_storage_ptr__,&local_34);
  }
  else {
    OVar3 = Instruction::opcode(pIStack_28);
    iVar4 = spvOpcodeIsConstant(OVar3);
    if (iVar4 != 0) {
      OVar3 = Instruction::opcode(pIStack_28);
      iVar4 = spvOpcodeIsSpecConstant(OVar3);
      if (iVar4 == 0) {
        OVar3 = Instruction::opcode(pIStack_28);
        if (OVar3 == OpConstantNull) {
          local_55 = true;
          local_56 = true;
          local_5c = 0;
          std::make_tuple<bool,bool,int>(&local_54,&local_55,&local_56,&local_5c);
          std::tuple<bool,_bool,_unsigned_int>::tuple<bool,_bool,_int,_true,_true>
                    (__return_storage_ptr__,&local_54);
          return __return_storage_ptr__;
        }
        this_00 = Instruction::words(pIStack_28);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
        if (sVar5 == 4) {
          local_5d = true;
          local_5e = true;
          local_64 = Instruction::word(pIStack_28,3);
          std::make_tuple<bool,bool,unsigned_int>
                    (__return_storage_ptr__,&local_5d,&local_5e,&local_64);
          return __return_storage_ptr__;
        }
        __assert_fail("inst->words().size() == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x5a3,
                      "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                     );
      }
    }
    local_45 = true;
    local_46 = false;
    local_4c = 0;
    std::make_tuple<bool,bool,int>(&local_44,&local_45,&local_46,&local_4c);
    std::tuple<bool,_bool,_unsigned_int>::tuple<bool,_bool,_int,_true,_true>
              (__return_storage_ptr__,&local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, bool, uint32_t> ValidationState_t::EvalInt32IfConst(
    uint32_t id) const {
  const Instruction* const inst = FindDef(id);
  assert(inst);
  const uint32_t type = inst->type_id();

  if (type == 0 || !IsIntScalarType(type) || GetBitWidth(type) != 32) {
    return std::make_tuple(false, false, 0);
  }

  // Spec constant values cannot be evaluated so don't consider constant for
  // the purpose of this method.
  if (!spvOpcodeIsConstant(inst->opcode()) ||
      spvOpcodeIsSpecConstant(inst->opcode())) {
    return std::make_tuple(true, false, 0);
  }

  if (inst->opcode() == spv::Op::OpConstantNull) {
    return std::make_tuple(true, true, 0);
  }

  assert(inst->words().size() == 4);
  return std::make_tuple(true, true, inst->word(3));
}